

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Attach(Parse *pParse,Expr *p,Expr *pDbname,Expr *pKey)

{
  Expr *pKey_local;
  Expr *pDbname_local;
  Expr *p_local;
  Parse *pParse_local;
  
  codeAttach(pParse,0x18,&sqlite3Attach::attach_func,p,p,pDbname,pKey);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Attach(Parse *pParse, Expr *p, Expr *pDbname, Expr *pKey){
  static const FuncDef attach_func = {
    3,                /* nArg */
    SQLITE_UTF8,      /* funcFlags */
    0,                /* pUserData */
    0,                /* pNext */
    attachFunc,       /* xSFunc */
    0,                /* xFinalize */
    0, 0,             /* xValue, xInverse */
    "sqlite_attach",  /* zName */
    {0}
  };
  codeAttach(pParse, SQLITE_ATTACH, &attach_func, p, p, pDbname, pKey);
}